

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3GenerateConstraintChecks
               (Parse *pParse,Table *pTab,int baseCur,int regRowid,int *aRegIdx,int rowidChng,
               int isUpdate,int overrideError,int ignoreDest,int *pbMayReplace)

{
  short sVar1;
  sqlite3 *db_00;
  ExprList *pEVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int addr;
  Vdbe *p;
  char *pcVar6;
  int local_104;
  int local_f4;
  Trigger *local_f0;
  Trigger *pTrigger_1;
  char *zCol;
  char *zErr;
  char *zSep;
  StrAccum errMsg;
  int j;
  int idx;
  int regR;
  int regIdx;
  Trigger *pTrigger;
  char *zConsName;
  int allOk;
  ExprList *pCheck;
  char *zMsg;
  int regOldRowid;
  int seenReplace;
  sqlite3 *db;
  Index *pIdx;
  int iCur;
  int regData;
  int j3;
  int j2;
  int j1;
  int onError;
  int nCol;
  Vdbe *v;
  int i;
  int rowidChng_local;
  int *aRegIdx_local;
  int regRowid_local;
  int baseCur_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  regData = 0;
  zMsg._4_4_ = 0;
  local_f4 = regRowid;
  if ((rowidChng != 0) && (isUpdate != 0)) {
    local_f4 = rowidChng;
  }
  db_00 = pParse->db;
  p = sqlite3GetVdbe(pParse);
  sVar1 = pTab->nCol;
  iVar3 = regRowid + 1;
  for (v._0_4_ = 0; (int)v < sVar1; v._0_4_ = (int)v + 1) {
    if (((int)v != pTab->iPKey) && (j2 = (int)pTab->aCol[(int)v].notNull, j2 != 0)) {
      if (overrideError == 99) {
        if (j2 == 99) {
          j2 = 2;
        }
      }
      else {
        j2 = overrideError;
      }
      if ((j2 == 5) && (pTab->aCol[(int)v].pDflt == (Expr *)0x0)) {
        j2 = 2;
      }
      switch(j2) {
      case 2:
        sqlite3MayAbort(pParse);
      case 1:
      case 3:
        sqlite3VdbeAddOp3(p,5,0x513,j2,iVar3 + (int)v);
        pcVar6 = sqlite3MPrintf(db_00,"%s.%s may not be NULL",pTab->zName,pTab->aCol[(int)v].zName);
        sqlite3VdbeChangeP4(p,-1,pcVar6,-1);
        break;
      case 4:
        sqlite3VdbeAddOp2(p,0x49,iVar3 + (int)v,ignoreDest);
        break;
      default:
        iVar4 = sqlite3VdbeAddOp1(p,0x4a,iVar3 + (int)v);
        sqlite3ExprCode(pParse,pTab->aCol[(int)v].pDflt,iVar3 + (int)v);
        sqlite3VdbeJumpHere(p,iVar4);
      }
    }
  }
  if ((pTab->pCheck != (ExprList *)0x0) && ((db_00->flags & 0x400U) == 0)) {
    pEVar2 = pTab->pCheck;
    pParse->ckBase = iVar3;
    if (overrideError == 99) {
      local_104 = 2;
    }
    else {
      local_104 = overrideError;
    }
    j2 = local_104;
    for (v._0_4_ = 0; (int)v < pEVar2->nExpr; v._0_4_ = (int)v + 1) {
      iVar4 = sqlite3VdbeMakeLabel(p);
      sqlite3ExprIfTrue(pParse,pEVar2->a[(int)v].pExpr,iVar4,8);
      if (j2 == 4) {
        sqlite3VdbeAddOp2(p,1,0,ignoreDest);
      }
      else {
        pcVar6 = pEVar2->a[(int)v].zName;
        if (j2 == 5) {
          j2 = 2;
        }
        if (pcVar6 == (char *)0x0) {
          pTrigger = (Trigger *)0x0;
        }
        else {
          pTrigger = (Trigger *)sqlite3MPrintf(db_00,"constraint %s failed",pcVar6);
        }
        sqlite3HaltConstraint(pParse,0x113,j2,(char *)pTrigger,-1);
      }
      sqlite3VdbeResolveLabel(p,iVar4);
    }
  }
  if (rowidChng == 0) goto LAB_001e40ef;
  j2 = (int)pTab->keyConf;
  if (overrideError == 99) {
    if (j2 == 99) {
      j2 = 2;
    }
  }
  else {
    j2 = overrideError;
  }
  if (isUpdate != 0) {
    regData = sqlite3VdbeAddOp3(p,0x4c,regRowid,0,rowidChng);
  }
  iVar4 = sqlite3VdbeAddOp3(p,0x36,baseCur,0,regRowid);
  if (j2 - 1U < 3) {
LAB_001e3fd8:
    sqlite3HaltConstraint(pParse,0x613,j2,"PRIMARY KEY must be unique",-2);
  }
  else if (j2 == 4) {
    sqlite3VdbeAddOp2(p,1,0,ignoreDest);
  }
  else {
    if (j2 != 5) {
      j2 = 2;
      goto LAB_001e3fd8;
    }
    _regR = (Trigger *)0x0;
    if ((db_00->flags & 0x20000U) != 0) {
      _regR = sqlite3TriggersExist(pParse,pTab,0x6a,(ExprList *)0x0,(int *)0x0);
    }
    if ((_regR == (Trigger *)0x0) &&
       (iVar5 = sqlite3FkRequired(pParse,pTab,(int *)0x0,0), iVar5 == 0)) {
      if (pTab->pIndex != (Index *)0x0) {
        sqlite3MultiWrite(pParse);
        sqlite3GenerateRowIndexDelete(pParse,pTab,baseCur,(int *)0x0);
      }
    }
    else {
      sqlite3MultiWrite(pParse);
      sqlite3GenerateRowDelete(pParse,pTab,baseCur,regRowid,0,_regR,5);
    }
    zMsg._4_4_ = 1;
  }
  sqlite3VdbeJumpHere(p,iVar4);
  if (isUpdate != 0) {
    sqlite3VdbeJumpHere(p,regData);
  }
LAB_001e40ef:
  pIdx._4_4_ = 0;
  for (db = (sqlite3 *)pTab->pIndex; db != (sqlite3 *)0x0; db = *(sqlite3 **)&db->nDb) {
    if (aRegIdx[pIdx._4_4_] != 0) {
      iVar4 = sqlite3GetTempRange(pParse,db->dbOptFlags + 1);
      for (v._0_4_ = 0; (int)v < (int)(uint)db->dbOptFlags; v._0_4_ = (int)v + 1) {
        errMsg._36_4_ = *(int *)((long)&db->pVdbe->db + (long)(int)v * 4);
        if (errMsg._36_4_ == (int)pTab->iPKey) {
          sqlite3VdbeAddOp2(p,0xf,regRowid,iVar4 + (int)v);
        }
        else {
          sqlite3VdbeAddOp2(p,0xf,iVar3 + errMsg._36_4_,iVar4 + (int)v);
        }
      }
      sqlite3VdbeAddOp2(p,0xf,regRowid,iVar4 + (int)v);
      sqlite3VdbeAddOp3(p,0x1f,iVar4,db->dbOptFlags + 1,aRegIdx[pIdx._4_4_]);
      pcVar6 = sqlite3IndexAffinityStr(p,(Index *)db);
      sqlite3VdbeChangeP4(p,-1,pcVar6,0);
      sqlite3ExprCacheAffinityChange(pParse,iVar4,db->dbOptFlags + 1);
      j2 = (int)db->autoCommit;
      if (j2 == 0) {
        sqlite3ReleaseTempRange(pParse,iVar4,db->dbOptFlags + 1);
      }
      else {
        if (overrideError == 99) {
          if (j2 == 99) {
            j2 = 2;
          }
        }
        else {
          j2 = overrideError;
        }
        if (zMsg._4_4_ != 0) {
          if (j2 == 4) {
            j2 = 5;
          }
          else if (j2 == 3) {
            j2 = 2;
          }
        }
        iVar5 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(p,0xf,local_f4,iVar5);
        addr = sqlite3VdbeAddOp4(p,0x35,baseCur + 1 + pIdx._4_4_,0,iVar5,(char *)(long)iVar4,-0xe);
        sqlite3ReleaseTempRange(pParse,iVar4,db->dbOptFlags + 1);
        if (j2 - 1U < 3) {
          sqlite3StrAccumInit((StrAccum *)&zSep,(char *)0x0,0,200);
          zErr = "column ";
          if (1 < db->dbOptFlags) {
            zErr = "columns ";
          }
          zSep = (char *)db_00;
          for (errMsg.mxAlloc = 0; errMsg.mxAlloc < (int)(uint)db->dbOptFlags;
              errMsg.mxAlloc = errMsg.mxAlloc + 1) {
            pcVar6 = pTab->aCol[*(int *)((long)&db->pVdbe->db + (long)errMsg.mxAlloc * 4)].zName;
            sqlite3StrAccumAppend((StrAccum *)&zSep,zErr,-1);
            zErr = ", ";
            sqlite3StrAccumAppend((StrAccum *)&zSep,pcVar6,-1);
          }
          pcVar6 = " is not unique";
          if (1 < db->dbOptFlags) {
            pcVar6 = " are not unique";
          }
          sqlite3StrAccumAppend((StrAccum *)&zSep,pcVar6,-1);
          pcVar6 = sqlite3StrAccumFinish((StrAccum *)&zSep);
          sqlite3HaltConstraint(pParse,0x813,j2,pcVar6,0);
          sqlite3DbFree((sqlite3 *)zSep,pcVar6);
        }
        else if (j2 == 4) {
          sqlite3VdbeAddOp2(p,1,0,ignoreDest);
        }
        else {
          local_f0 = (Trigger *)0x0;
          sqlite3MultiWrite(pParse);
          if ((db_00->flags & 0x20000U) != 0) {
            local_f0 = sqlite3TriggersExist(pParse,pTab,0x6a,(ExprList *)0x0,(int *)0x0);
          }
          sqlite3GenerateRowDelete(pParse,pTab,baseCur,iVar5,0,local_f0,5);
          zMsg._4_4_ = 1;
        }
        sqlite3VdbeJumpHere(p,addr);
        sqlite3ReleaseTempReg(pParse,iVar5);
      }
    }
    pIdx._4_4_ = pIdx._4_4_ + 1;
  }
  if (pbMayReplace != (int *)0x0) {
    *pbMayReplace = zMsg._4_4_;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateConstraintChecks(
  Parse *pParse,      /* The parser context */
  Table *pTab,        /* the table into which we are inserting */
  int baseCur,        /* Index of a read/write cursor pointing at pTab */
  int regRowid,       /* Index of the range of input registers */
  int *aRegIdx,       /* Register used by each index.  0 for unused indices */
  int rowidChng,      /* True if the rowid might collide with existing entry */
  int isUpdate,       /* True for UPDATE, False for INSERT */
  int overrideError,  /* Override onError to this if not OE_Default */
  int ignoreDest,     /* Jump to this label on an OE_Ignore resolution */
  int *pbMayReplace   /* OUT: Set to true if constraint may cause a replace */
){
  int i;              /* loop counter */
  Vdbe *v;            /* VDBE under constrution */
  int nCol;           /* Number of columns */
  int onError;        /* Conflict resolution strategy */
  int j1;             /* Addresss of jump instruction */
  int j2 = 0, j3;     /* Addresses of jump instructions */
  int regData;        /* Register containing first data column */
  int iCur;           /* Table cursor number */
  Index *pIdx;         /* Pointer to one of the indices */
  sqlite3 *db;         /* Database connection */
  int seenReplace = 0; /* True if REPLACE is used to resolve INT PK conflict */
  int regOldRowid = (rowidChng && isUpdate) ? rowidChng : regRowid;

  db = pParse->db;
  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  nCol = pTab->nCol;
  regData = regRowid + 1;

  /* Test all NOT NULL constraints.
  */
  for(i=0; i<nCol; i++){
    if( i==pTab->iPKey ){
      continue;
    }
    onError = pTab->aCol[i].notNull;
    if( onError==OE_None ) continue;
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    if( onError==OE_Replace && pTab->aCol[i].pDflt==0 ){
      onError = OE_Abort;
    }
    assert( onError==OE_Rollback || onError==OE_Abort || onError==OE_Fail
        || onError==OE_Ignore || onError==OE_Replace );
    switch( onError ){
      case OE_Abort:
        sqlite3MayAbort(pParse);
      case OE_Rollback:
      case OE_Fail: {
        char *zMsg;
        sqlite3VdbeAddOp3(v, OP_HaltIfNull,
                          SQLITE_CONSTRAINT_NOTNULL, onError, regData+i);
        zMsg = sqlite3MPrintf(db, "%s.%s may not be NULL",
                              pTab->zName, pTab->aCol[i].zName);
        sqlite3VdbeChangeP4(v, -1, zMsg, P4_DYNAMIC);
        break;
      }
      case OE_Ignore: {
        sqlite3VdbeAddOp2(v, OP_IsNull, regData+i, ignoreDest);
        break;
      }
      default: {
        assert( onError==OE_Replace );
        j1 = sqlite3VdbeAddOp1(v, OP_NotNull, regData+i);
        sqlite3ExprCode(pParse, pTab->aCol[i].pDflt, regData+i);
        sqlite3VdbeJumpHere(v, j1);
        break;
      }
    }
  }

  /* Test all CHECK constraints
  */
#ifndef SQLITE_OMIT_CHECK
  if( pTab->pCheck && (db->flags & SQLITE_IgnoreChecks)==0 ){
    ExprList *pCheck = pTab->pCheck;
    pParse->ckBase = regData;
    onError = overrideError!=OE_Default ? overrideError : OE_Abort;
    for(i=0; i<pCheck->nExpr; i++){
      int allOk = sqlite3VdbeMakeLabel(v);
      sqlite3ExprIfTrue(pParse, pCheck->a[i].pExpr, allOk, SQLITE_JUMPIFNULL);
      if( onError==OE_Ignore ){
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
      }else{
        char *zConsName = pCheck->a[i].zName;
        if( onError==OE_Replace ) onError = OE_Abort; /* IMP: R-15569-63625 */
        if( zConsName ){
          zConsName = sqlite3MPrintf(db, "constraint %s failed", zConsName);
        }else{
          zConsName = 0;
        }
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_CHECK,
                              onError, zConsName, P4_DYNAMIC);
      }
      sqlite3VdbeResolveLabel(v, allOk);
    }
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* If we have an INTEGER PRIMARY KEY, make sure the primary key
  ** of the new record does not previously exist.  Except, if this
  ** is an UPDATE and the primary key is not changing, that is OK.
  */
  if( rowidChng ){
    onError = pTab->keyConf;
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    
    if( isUpdate ){
      j2 = sqlite3VdbeAddOp3(v, OP_Eq, regRowid, 0, rowidChng);
    }
    j3 = sqlite3VdbeAddOp3(v, OP_NotExists, baseCur, 0, regRowid);
    switch( onError ){
      default: {
        onError = OE_Abort;
        /* Fall thru into the next case */
      }
      case OE_Rollback:
      case OE_Abort:
      case OE_Fail: {
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_PRIMARYKEY,
           onError, "PRIMARY KEY must be unique", P4_STATIC);
        break;
      }
      case OE_Replace: {
        /* If there are DELETE triggers on this table and the
        ** recursive-triggers flag is set, call GenerateRowDelete() to
        ** remove the conflicting row from the table. This will fire
        ** the triggers and remove both the table and index b-tree entries.
        **
        ** Otherwise, if there are no triggers or the recursive-triggers
        ** flag is not set, but the table has one or more indexes, call 
        ** GenerateRowIndexDelete(). This removes the index b-tree entries 
        ** only. The table b-tree entry will be replaced by the new entry 
        ** when it is inserted.  
        **
        ** If either GenerateRowDelete() or GenerateRowIndexDelete() is called,
        ** also invoke MultiWrite() to indicate that this VDBE may require
        ** statement rollback (if the statement is aborted after the delete
        ** takes place). Earlier versions called sqlite3MultiWrite() regardless,
        ** but being more selective here allows statements like:
        **
        **   REPLACE INTO t(rowid) VALUES($newrowid)
        **
        ** to run without a statement journal if there are no indexes on the
        ** table.
        */
        Trigger *pTrigger = 0;
        if( db->flags&SQLITE_RecTriggers ){
          pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
        }
        if( pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0) ){
          sqlite3MultiWrite(pParse);
          sqlite3GenerateRowDelete(
              pParse, pTab, baseCur, regRowid, 0, pTrigger, OE_Replace
          );
        }else if( pTab->pIndex ){
          sqlite3MultiWrite(pParse);
          sqlite3GenerateRowIndexDelete(pParse, pTab, baseCur, 0);
        }
        seenReplace = 1;
        break;
      }
      case OE_Ignore: {
        assert( seenReplace==0 );
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
        break;
      }
    }
    sqlite3VdbeJumpHere(v, j3);
    if( isUpdate ){
      sqlite3VdbeJumpHere(v, j2);
    }
  }

  /* Test all UNIQUE constraints by creating entries for each UNIQUE
  ** index and making sure that duplicate entries do not already exist.
  ** Add the new records to the indices as we go.
  */
  for(iCur=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, iCur++){
    int regIdx;
    int regR;

    if( aRegIdx[iCur]==0 ) continue;  /* Skip unused indices */

    /* Create a key for accessing the index entry */
    regIdx = sqlite3GetTempRange(pParse, pIdx->nColumn+1);
    for(i=0; i<pIdx->nColumn; i++){
      int idx = pIdx->aiColumn[i];
      if( idx==pTab->iPKey ){
        sqlite3VdbeAddOp2(v, OP_SCopy, regRowid, regIdx+i);
      }else{
        sqlite3VdbeAddOp2(v, OP_SCopy, regData+idx, regIdx+i);
      }
    }
    sqlite3VdbeAddOp2(v, OP_SCopy, regRowid, regIdx+i);
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regIdx, pIdx->nColumn+1, aRegIdx[iCur]);
    sqlite3VdbeChangeP4(v, -1, sqlite3IndexAffinityStr(v, pIdx), P4_TRANSIENT);
    sqlite3ExprCacheAffinityChange(pParse, regIdx, pIdx->nColumn+1);

    /* Find out what action to take in case there is an indexing conflict */
    onError = pIdx->onError;
    if( onError==OE_None ){ 
      sqlite3ReleaseTempRange(pParse, regIdx, pIdx->nColumn+1);
      continue;  /* pIdx is not a UNIQUE index */
    }
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    if( seenReplace ){
      if( onError==OE_Ignore ) onError = OE_Replace;
      else if( onError==OE_Fail ) onError = OE_Abort;
    }
    
    /* Check to see if the new index entry will be unique */
    regR = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp2(v, OP_SCopy, regOldRowid, regR);
    j3 = sqlite3VdbeAddOp4(v, OP_IsUnique, baseCur+iCur+1, 0,
                           regR, SQLITE_INT_TO_PTR(regIdx),
                           P4_INT32);
    sqlite3ReleaseTempRange(pParse, regIdx, pIdx->nColumn+1);

    /* Generate code that executes if the new index entry is not unique */
    assert( onError==OE_Rollback || onError==OE_Abort || onError==OE_Fail
        || onError==OE_Ignore || onError==OE_Replace );
    switch( onError ){
      case OE_Rollback:
      case OE_Abort:
      case OE_Fail: {
        int j;
        StrAccum errMsg;
        const char *zSep;
        char *zErr;

        sqlite3StrAccumInit(&errMsg, 0, 0, 200);
        errMsg.db = db;
        zSep = pIdx->nColumn>1 ? "columns " : "column ";
        for(j=0; j<pIdx->nColumn; j++){
          char *zCol = pTab->aCol[pIdx->aiColumn[j]].zName;
          sqlite3StrAccumAppend(&errMsg, zSep, -1);
          zSep = ", ";
          sqlite3StrAccumAppend(&errMsg, zCol, -1);
        }
        sqlite3StrAccumAppend(&errMsg,
            pIdx->nColumn>1 ? " are not unique" : " is not unique", -1);
        zErr = sqlite3StrAccumFinish(&errMsg);
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_UNIQUE,
                              onError, zErr, 0);
        sqlite3DbFree(errMsg.db, zErr);
        break;
      }
      case OE_Ignore: {
        assert( seenReplace==0 );
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
        break;
      }
      default: {
        Trigger *pTrigger = 0;
        assert( onError==OE_Replace );
        sqlite3MultiWrite(pParse);
        if( db->flags&SQLITE_RecTriggers ){
          pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
        }
        sqlite3GenerateRowDelete(
            pParse, pTab, baseCur, regR, 0, pTrigger, OE_Replace
        );
        seenReplace = 1;
        break;
      }
    }
    sqlite3VdbeJumpHere(v, j3);
    sqlite3ReleaseTempReg(pParse, regR);
  }
  
  if( pbMayReplace ){
    *pbMayReplace = seenReplace;
  }
}